

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-whisper.cpp
# Opt level: O2

bool speak_with_file(string *command,string *text,string *path,int voice_id)

{
  int iVar1;
  bool bVar2;
  char *__format;
  string sStack_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  ofstream speak_file;
  byte abStack_208 [480];
  
  std::ofstream::ofstream(&speak_file,(path->_M_dataplus)._M_p,_S_out);
  if ((abStack_208[*(long *)(_speak_file + -0x18)] & 5) == 0) {
    std::ostream::write((char *)&speak_file,(long)(text->_M_dataplus)._M_p);
    std::ofstream::close();
    std::operator+(&local_2a8,command," ");
    std::__cxx11::to_string(&sStack_2c8,voice_id);
    std::operator+(&local_288,&local_2a8,&sStack_2c8);
    std::operator+(&local_268,&local_288," ");
    std::operator+(&local_248,&local_268,path);
    iVar1 = system(local_248._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&sStack_2c8);
    std::__cxx11::string::~string((string *)&local_2a8);
    bVar2 = true;
    if (iVar1 == 0) goto LAB_0017451c;
    __format = "%s: failed to speak\n";
  }
  else {
    __format = "%s: failed to open speak_file\n";
  }
  bVar2 = false;
  fprintf(_stderr,__format,"speak_with_file");
LAB_0017451c:
  std::ofstream::~ofstream(&speak_file);
  return bVar2;
}

Assistant:

bool speak_with_file(const std::string & command, const std::string & text, const std::string & path, int voice_id) {
    std::ofstream speak_file(path.c_str());
    if (speak_file.fail()) {
        fprintf(stderr, "%s: failed to open speak_file\n", __func__);
        return false;
    } else {
        speak_file.write(text.c_str(), text.size());
        speak_file.close();
        int ret = system((command + " " + std::to_string(voice_id) + " " + path).c_str());
        if (ret != 0) {
            fprintf(stderr, "%s: failed to speak\n", __func__);
            return false;
        }
    }
    return true;
}